

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx::create_pipeline_fp16s(InnerProduct_x86_avx *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  byte *in_RSI;
  Mat *in_RDI;
  int num_input;
  Option *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  size_t *psVar4;
  undefined4 in_stack_ffffffffffffffd0;
  
  innerproduct_transform_kernel_fp16s_sse
            ((Mat *)CONCAT44(*(int *)&in_RDI[3].data / (int)in_RDI[2].cstep,
                             in_stack_ffffffffffffffd0),in_RDI,
             (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  if ((*in_RSI & 1) != 0) {
    psVar4 = &in_RDI[4].elemsize;
    if (*(long *)&in_RDI[4].elempack != 0) {
      piVar2 = *(int **)&in_RDI[4].elempack;
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        lVar3._0_4_ = in_RDI[4].h;
        lVar3._4_4_ = in_RDI[4].d;
        if (lVar3 == 0) {
          if ((void *)*psVar4 != (void *)0x0) {
            free((void *)*psVar4);
          }
        }
        else {
          (**(code **)(**(long **)&in_RDI[4].h + 0x18))(*(long **)&in_RDI[4].h,*psVar4);
        }
      }
    }
    *psVar4 = 0;
    psVar4[2] = 0;
    *(int *)(psVar4 + 3) = 0;
    *(int *)(psVar4 + 5) = 0;
    *(undefined4 *)((long)psVar4 + 0x2c) = 0;
    *(undefined4 *)(psVar4 + 6) = 0;
    *(undefined4 *)((long)psVar4 + 0x34) = 0;
    *(undefined4 *)(psVar4 + 7) = 0;
    psVar4[8] = 0;
    psVar4[1] = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}